

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_TestSubtypeErrors_Test::TestBody(IsorecursiveTest_TestSubtypeErrors_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  bool bVar1;
  HeapType HVar2;
  char *pcVar3;
  char *in_R9;
  Entry EVar4;
  string local_538;
  AssertHelper local_518;
  Message local_510;
  BuildResult local_508;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar__3;
  Entry local_4b8;
  Entry local_4a8;
  allocator<wasm::Field> local_491;
  uintptr_t local_490;
  uintptr_t local_488;
  Field local_480;
  Field local_470;
  iterator local_460;
  size_type local_458;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_450;
  Struct local_438;
  Entry local_420;
  allocator<wasm::Field> local_409;
  uintptr_t local_408;
  uintptr_t local_400;
  Field local_3f8;
  Field local_3e8;
  iterator local_3d8;
  size_type local_3d0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_3c8;
  Struct local_3b0;
  TypeBuilder local_398;
  TypeBuilder builder_3;
  AssertHelper local_370;
  Message local_368;
  BuildResult local_360;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__2;
  Entry local_310;
  Entry local_300;
  uintptr_t local_2f0;
  Field local_2e8;
  Array local_2d8;
  Entry local_2c8;
  uintptr_t local_2b8;
  Field local_2b0;
  Array local_2a0;
  TypeBuilder local_290;
  TypeBuilder builder_2;
  AssertHelper local_268;
  Message local_260;
  BuildResult local_258;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__1;
  Entry local_208;
  Entry local_1f8;
  uintptr_t local_1e8;
  uintptr_t local_1e0;
  uintptr_t local_1d8;
  uintptr_t *local_1d0;
  undefined8 local_1c8;
  Type local_1c0;
  Type local_1b8;
  Signature local_1b0;
  Entry local_1a0;
  uintptr_t local_190;
  uintptr_t local_188;
  uintptr_t *local_180;
  undefined8 local_178;
  Type local_170;
  Type local_168;
  Signature local_160;
  TypeBuilder local_150;
  TypeBuilder builder_1;
  AssertHelper local_128;
  Message local_120;
  BuildResult local_118;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Entry local_c8;
  Entry local_b8;
  Type local_a8;
  Type local_a0;
  Signature local_98;
  Entry local_88;
  uintptr_t local_78;
  Type local_60;
  Signature local_58;
  TypeBuilder local_48;
  TypeBuilder builder;
  Type local_38;
  Type funcref;
  Type local_28;
  Type eqref;
  Type local_18;
  Type anyref;
  IsorecursiveTest_TestSubtypeErrors_Test *this_local;
  
  anyref.id = (uintptr_t)this;
  wasm::HeapType::HeapType((HeapType *)&eqref,any);
  wasm::Type::Type(&local_18,(HeapType)eqref.id,Nullable);
  wasm::HeapType::HeapType((HeapType *)&funcref,eq);
  wasm::Type::Type(&local_28,(HeapType)funcref.id,Nullable);
  wasm::HeapType::HeapType((HeapType *)&builder,func);
  wasm::Type::Type(&local_38,
                   (HeapType)
                   builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,Nullable);
  wasm::TypeBuilder::TypeBuilder(&local_48,2);
  wasm::Type::Type(&local_60,none);
  local_78 = local_18.id;
  wasm::Signature::Signature(&local_58,local_60,local_18);
  local_88 = wasm::TypeBuilder::operator[](&local_48,0);
  wasm::TypeBuilder::Entry::operator=(&local_88,local_58);
  local_a0.id = local_18.id;
  wasm::Type::Type(&local_a8,none);
  wasm::Signature::Signature(&local_98,local_a0,local_a8);
  local_b8 = wasm::TypeBuilder::operator[](&local_48,1);
  wasm::TypeBuilder::Entry::operator=(&local_b8,local_98);
  local_c8 = wasm::TypeBuilder::operator[](&local_48,1);
  EVar4 = wasm::TypeBuilder::operator[](&local_48,0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar4.builder;
  HVar2 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&gtest_ar_.message_);
  wasm::TypeBuilder::Entry::subTypeOf(&local_c8,HVar2);
  wasm::TypeBuilder::build();
  bVar1 = wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_118);
  local_f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  wasm::TypeBuilder::BuildResult::~BuildResult(&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder_1,(internal *)local_f0,(AssertionResult *)"builder.build()","true"
               ,"false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x34b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&builder_1);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  wasm::TypeBuilder::~TypeBuilder(&local_48);
  wasm::TypeBuilder::TypeBuilder(&local_150,2);
  wasm::Type::Type(&local_168,none);
  local_190 = local_18.id;
  local_188 = local_18.id;
  local_180 = &local_190;
  local_178 = 2;
  wasm::Type::Type(&local_170,local_180,2);
  wasm::Signature::Signature(&local_160,local_168,local_170);
  local_1a0 = wasm::TypeBuilder::operator[](&local_150,0);
  wasm::TypeBuilder::Entry::operator=(&local_1a0,local_160);
  wasm::Type::Type(&local_1b8,none);
  local_1e8 = local_18.id;
  local_1e0 = local_18.id;
  local_1d8 = local_18.id;
  local_1d0 = &local_1e8;
  local_1c8 = 3;
  wasm::Type::Type(&local_1c0,local_1d0,3);
  wasm::Signature::Signature(&local_1b0,local_1b8,local_1c0);
  local_1f8 = wasm::TypeBuilder::operator[](&local_150,1);
  wasm::TypeBuilder::Entry::operator=(&local_1f8,local_1b0);
  local_208 = wasm::TypeBuilder::operator[](&local_150,1);
  EVar4 = wasm::TypeBuilder::operator[](&local_150,0);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar4.builder;
  HVar2 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&gtest_ar__1.message_);
  wasm::TypeBuilder::Entry::subTypeOf(&local_208,HVar2);
  wasm::TypeBuilder::build();
  bVar1 = wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_258);
  local_231 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_230,&local_231,(type *)0x0);
  wasm::TypeBuilder::BuildResult::~BuildResult(&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder_2,(internal *)local_230,(AssertionResult *)"builder.build()",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x354,pcVar3);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&builder_2);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  wasm::TypeBuilder::~TypeBuilder(&local_150);
  wasm::TypeBuilder::TypeBuilder(&local_290,2);
  local_2b8 = local_18.id;
  wasm::Field::Field(&local_2b0,local_18,Mutable);
  wasm::Array::Array(&local_2a0,local_2b0);
  local_2c8 = wasm::TypeBuilder::operator[](&local_290,0);
  wasm::TypeBuilder::Entry::operator=(&local_2c8,&local_2a0);
  local_2f0 = local_28.id;
  wasm::Field::Field(&local_2e8,local_28,Mutable);
  wasm::Array::Array(&local_2d8,local_2e8);
  local_300 = wasm::TypeBuilder::operator[](&local_290,1);
  wasm::TypeBuilder::Entry::operator=(&local_300,&local_2d8);
  local_310 = wasm::TypeBuilder::operator[](&local_290,1);
  EVar4 = wasm::TypeBuilder::operator[](&local_290,0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar4.builder;
  HVar2 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&gtest_ar__2.message_);
  wasm::TypeBuilder::Entry::subTypeOf(&local_310,HVar2);
  wasm::TypeBuilder::build();
  bVar1 = wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_360);
  local_339 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_338,&local_339,(type *)0x0);
  wasm::TypeBuilder::BuildResult::~BuildResult(&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder_3,(internal *)local_338,(AssertionResult *)"builder.build()",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x35d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&builder_3);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  wasm::TypeBuilder::~TypeBuilder(&local_290);
  wasm::TypeBuilder::TypeBuilder(&local_398,2);
  local_400 = local_18.id;
  wasm::Field::Field(&local_3f8,local_18,Immutable);
  local_408 = local_18.id;
  wasm::Field::Field(&local_3e8,local_18,Immutable);
  local_3d8 = &local_3f8;
  local_3d0 = 2;
  std::allocator<wasm::Field>::allocator(&local_409);
  __l_00._M_len = local_3d0;
  __l_00._M_array = local_3d8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_3c8,__l_00,&local_409);
  wasm::Struct::Struct(&local_3b0,&local_3c8);
  local_420 = wasm::TypeBuilder::operator[](&local_398,0);
  wasm::TypeBuilder::Entry::operator=(&local_420,&local_3b0);
  wasm::Struct::~Struct(&local_3b0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_3c8);
  std::allocator<wasm::Field>::~allocator(&local_409);
  local_488 = local_38.id;
  wasm::Field::Field(&local_480,local_38,Immutable);
  local_490 = local_18.id;
  wasm::Field::Field(&local_470,local_18,Immutable);
  local_460 = &local_480;
  local_458 = 2;
  std::allocator<wasm::Field>::allocator(&local_491);
  __l._M_len = local_458;
  __l._M_array = local_460;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_450,__l,&local_491);
  wasm::Struct::Struct(&local_438,&local_450);
  local_4a8 = wasm::TypeBuilder::operator[](&local_398,1);
  wasm::TypeBuilder::Entry::operator=(&local_4a8,&local_438);
  wasm::Struct::~Struct(&local_438);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_450);
  std::allocator<wasm::Field>::~allocator(&local_491);
  local_4b8 = wasm::TypeBuilder::operator[](&local_398,1);
  EVar4 = wasm::TypeBuilder::operator[](&local_398,0);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )EVar4.builder;
  HVar2 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&gtest_ar__3.message_);
  wasm::TypeBuilder::Entry::subTypeOf(&local_4b8,HVar2);
  wasm::TypeBuilder::build();
  bVar1 = wasm::TypeBuilder::BuildResult::operator_cast_to_bool(&local_508);
  local_4e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e0,&local_4e1,(type *)0x0);
  wasm::TypeBuilder::BuildResult::~BuildResult(&local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_538,(internal *)local_4e0,(AssertionResult *)"builder.build()","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x366,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  wasm::TypeBuilder::~TypeBuilder(&local_398);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, TestSubtypeErrors) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);
  Type funcref = Type(HeapType::func, Nullable);

  {
    // Incompatible signatures.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, anyref);
    builder[1] = Signature(anyref, Type::none);
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Signatures incompatible in tuple size.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, {anyref, anyref});
    builder[1] = Signature(Type::none, {anyref, anyref, anyref});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Mutable array fields are invariant.
    TypeBuilder builder(2);
    builder[0] = Array(Field(anyref, Mutable));
    builder[1] = Array(Field(eqref, Mutable));
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Incompatible struct prefixes
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable), Field(anyref, Immutable)});
    builder[1] = Struct({Field(funcref, Immutable), Field(anyref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }
}